

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bash_prg.c
# Opt level: O0

void bashPrgStart(void *state,size_t l,size_t d,octet *ann,size_t ann_len,octet *key,size_t key_len)

{
  ulong uVar1;
  ulong in_RDX;
  ulong in_RSI;
  ulong *in_RDI;
  long in_R8;
  ulong in_stack_00000008;
  bash_prg_st *st;
  undefined7 in_stack_ffffffffffffffb8;
  octet in_stack_ffffffffffffffbf;
  void *in_stack_ffffffffffffffc0;
  
  in_RDI[0x1b] = in_R8 + 1 + in_stack_00000008;
  *(char *)(in_RDI + 2) = (char)(in_R8 << 2) + (char)(in_stack_00000008 >> 2);
  memCopy(in_stack_ffffffffffffffc0,
          (void *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),0x1309a6);
  memCopy(in_stack_ffffffffffffffc0,
          (void *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),0x1309c7);
  memSet(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf,0x1309f4);
  *(char *)(in_RDI + 0x19) = (char)(in_RSI >> 2) + (char)in_RDX;
  if (in_stack_00000008 == 0) {
    uVar1 = in_RDX * in_RSI >> 2;
  }
  else {
    uVar1 = in_RSI * (in_RDX + 2) >> 4;
  }
  in_RDI[0x1a] = 0xc0 - uVar1;
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  return;
}

Assistant:

void bashPrgStart(void* state, size_t l, size_t d, const octet ann[],
	size_t ann_len, const octet key[], size_t key_len)
{
	bash_prg_st* st = (bash_prg_st*)state;
	ASSERT(memIsValid(st, bashPrg_keep()));
	ASSERT(l == 128 || l == 192 || l == 256);
	ASSERT(d == 1 || d == 2);
	ASSERT(ann_len % 4 == 0 && ann_len <= 60);
	ASSERT(key_len % 4 == 0 && key_len <= 60);
	ASSERT(key_len == 0 || key_len >= l / 8);
	ASSERT(memIsDisjoint2(st, bashPrg_keep(), ann, ann_len));
	ASSERT(memIsDisjoint2(st, bashPrg_keep(), key, key_len));
	// pos <- 8 + |ann| + |key|
	st->pos = 1 + ann_len + key_len;
	// s[0..pos) <- <|ann|/2 + |key|/32>_8 || ann || key
	st->s[0] = (octet)(ann_len * 4 + key_len / 4);
	memCopy(st->s + 1, ann, ann_len); 
	memCopy(st->s + 1 + ann_len, key, key_len);
	// s[pos..) <- 0
	memSetZero(st->s + st->pos, 192 - st->pos);
	// s[1472..) <- <l / 4 + d>_{64}
	st->s[192 - 8] = (octet)(l / 4  + d);
	// длина буфера
	st->buf_len = key_len ? (192 - l * (2 + d) / 16) : (192 - d * l / 4);
	// сохранить параметры
	st->l = l, st->d = d;
}